

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
PairMatcherImpl<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>::
MatchAndExplain(PairMatcherImpl<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                *this,pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *a_pair,
               MatchResultListener *listener)

{
  bool bVar1;
  StringMatchResultListener second_inner_listener;
  StringMatchResultListener first_inner_listener;
  string sStack_398;
  string local_378;
  StringMatchResultListener local_358;
  StringMatchResultListener local_1c0;
  
  if (listener->stream_ == (ostream *)0x0) {
    bVar1 = MatcherBase<const_unsigned_int_&>::Matches
                      (&(this->first_matcher_).super_MatcherBase<const_unsigned_int_&>,
                       &a_pair->first);
    if (bVar1) {
      bVar1 = MatcherBase<const_proto2_unittest::Proto2MapEnumPlusExtra_&>::Matches
                        (&(this->second_matcher_).
                          super_MatcherBase<const_proto2_unittest::Proto2MapEnumPlusExtra_&>,
                         &a_pair->second);
      return bVar1;
    }
    bVar1 = false;
  }
  else {
    StringMatchResultListener::StringMatchResultListener(&local_1c0);
    bVar1 = MatcherBase<const_unsigned_int_&>::MatchAndExplain
                      (&(this->first_matcher_).super_MatcherBase<const_unsigned_int_&>,
                       &a_pair->first,&local_1c0.super_MatchResultListener);
    if (bVar1) {
      StringMatchResultListener::StringMatchResultListener(&local_358);
      bVar1 = MatcherBase<const_proto2_unittest::Proto2MapEnumPlusExtra_&>::MatchAndExplain
                        (&(this->second_matcher_).
                          super_MatcherBase<const_proto2_unittest::Proto2MapEnumPlusExtra_&>,
                         &a_pair->second,&local_358.super_MatchResultListener);
      if (bVar1) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringbuf::str();
        ExplainSuccess(this,&sStack_398,&local_378,listener);
        std::__cxx11::string::~string((string *)&local_378);
      }
      else {
        MatchResultListener::operator<<(listener,(char (*) [34])"whose second field does not match")
        ;
        std::__cxx11::stringbuf::str();
        PrintIfNotEmpty(&sStack_398,listener->stream_);
      }
      std::__cxx11::string::~string((string *)&sStack_398);
      StringMatchResultListener::~StringMatchResultListener(&local_358);
    }
    else {
      MatchResultListener::operator<<(listener,(char (*) [33])"whose first field does not match");
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty((string *)&local_358,listener->stream_);
      std::__cxx11::string::~string((string *)&local_358);
      bVar1 = false;
    }
    StringMatchResultListener::~StringMatchResultListener(&local_1c0);
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(PairType a_pair,
                       MatchResultListener* listener) const override {
    if (!listener->IsInterested()) {
      // If the listener is not interested, we don't need to construct the
      // explanation.
      return first_matcher_.Matches(pair_getters::First(a_pair, Rank1())) &&
             second_matcher_.Matches(pair_getters::Second(a_pair, Rank1()));
    }
    StringMatchResultListener first_inner_listener;
    if (!first_matcher_.MatchAndExplain(pair_getters::First(a_pair, Rank1()),
                                        &first_inner_listener)) {
      *listener << "whose first field does not match";
      PrintIfNotEmpty(first_inner_listener.str(), listener->stream());
      return false;
    }
    StringMatchResultListener second_inner_listener;
    if (!second_matcher_.MatchAndExplain(pair_getters::Second(a_pair, Rank1()),
                                         &second_inner_listener)) {
      *listener << "whose second field does not match";
      PrintIfNotEmpty(second_inner_listener.str(), listener->stream());
      return false;
    }
    ExplainSuccess(first_inner_listener.str(), second_inner_listener.str(),
                   listener);
    return true;
  }